

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O2

void __thiscall Assimp::ColladaExporter::WritePointLight(ColladaExporter *this,aiLight *light)

{
  undefined1 *puVar1;
  string *psVar2;
  string *psVar3;
  ostream *poVar4;
  
  puVar1 = &this->field_0x38;
  psVar2 = &this->startstr;
  poVar4 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar4 = std::operator<<(poVar4,"<point>");
  psVar3 = &this->endstr;
  std::operator<<(poVar4,(string *)psVar3);
  PushTag(this);
  poVar4 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar4 = std::operator<<(poVar4,"<color sid=\"color\">");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(light->mColorDiffuse).r);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(light->mColorDiffuse).g);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(light->mColorDiffuse).b);
  poVar4 = std::operator<<(poVar4,"</color>");
  std::operator<<(poVar4,(string *)psVar3);
  poVar4 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar4 = std::operator<<(poVar4,"<constant_attenuation>");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,light->mAttenuationConstant);
  poVar4 = std::operator<<(poVar4,"</constant_attenuation>");
  std::operator<<(poVar4,(string *)psVar3);
  poVar4 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar4 = std::operator<<(poVar4,"<linear_attenuation>");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,light->mAttenuationLinear);
  poVar4 = std::operator<<(poVar4,"</linear_attenuation>");
  std::operator<<(poVar4,(string *)psVar3);
  poVar4 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar4 = std::operator<<(poVar4,"<quadratic_attenuation>");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,light->mAttenuationQuadratic);
  poVar4 = std::operator<<(poVar4,"</quadratic_attenuation>");
  std::operator<<(poVar4,(string *)psVar3);
  PopTag(this);
  poVar4 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar4 = std::operator<<(poVar4,"</point>");
  std::operator<<(poVar4,(string *)psVar3);
  return;
}

Assistant:

void ColladaExporter::WritePointLight(const aiLight *const light){
    const aiColor3D &color=  light->mColorDiffuse;
    mOutput << startstr << "<point>" << endstr;
    PushTag();
    mOutput << startstr << "<color sid=\"color\">"
                            << color.r<<" "<<color.g<<" "<<color.b
                        <<"</color>" << endstr;
    mOutput << startstr << "<constant_attenuation>"
                            << light->mAttenuationConstant
                        <<"</constant_attenuation>" << endstr;
    mOutput << startstr << "<linear_attenuation>"
                            << light->mAttenuationLinear
                        <<"</linear_attenuation>" << endstr;
    mOutput << startstr << "<quadratic_attenuation>"
                            << light->mAttenuationQuadratic
                        <<"</quadratic_attenuation>" << endstr;

    PopTag();
    mOutput << startstr << "</point>" << endstr;

}